

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

void add_value(MatchState *ms,luaL_Buffer *b,char *s,char *e)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *in_RCX;
  luaL_Buffer *in_RDX;
  MatchState *in_RSI;
  long in_RDI;
  int n;
  lua_State *L;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  lua_State *L_00;
  lua_State *in_stack_ffffffffffffffc8;
  lua_State *L_01;
  int in_stack_ffffffffffffffd4;
  
  L_00 = *(lua_State **)(in_RDI + 0x10);
  iVar1 = lua_type(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (iVar1 - 3U < 2) {
    add_s(in_RSI,in_RDX,in_RCX,(char *)L_00);
  }
  else {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (iVar1 == 5) {
      push_onecapture((MatchState *)CONCAT44(in_stack_ffffffffffffffd4,5),iVar2,
                      (char *)in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      lua_gettable(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    }
    else if (iVar1 == 6) {
      lua_pushvalue((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,6),iVar2);
      in_stack_ffffffffffffffd4 =
           push_captures((MatchState *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                         (char *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0);
      lua_call(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    iVar2 = lua_toboolean(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar2 == 0) {
      lua_settop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      lua_pushlstring(L_00,(char *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                      (size_t)in_stack_ffffffffffffffc8);
    }
    else {
      iVar2 = lua_isstring((lua_State *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                           (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      if (iVar2 == 0) {
        L_01 = L_00;
        iVar1 = lua_type(L_00,(int)((ulong)L_00 >> 0x20));
        pcVar3 = lua_typename(L_00,iVar1);
        lj_err_callerv(L_01,LJ_ERR_STRGSRV,pcVar3);
      }
    }
    luaL_addvalue((luaL_Buffer *)CONCAT44(in_stack_ffffffffffffffd4,iVar1));
  }
  return;
}

Assistant:

static void add_value(MatchState *ms, luaL_Buffer *b,
		      const char *s, const char *e)
{
  lua_State *L = ms->L;
  switch (lua_type(L, 3)) {
    case LUA_TNUMBER:
    case LUA_TSTRING: {
      add_s(ms, b, s, e);
      return;
    }
    case LUA_TFUNCTION: {
      int n;
      lua_pushvalue(L, 3);
      n = push_captures(ms, s, e);
      lua_call(L, n, 1);
      break;
    }
    case LUA_TTABLE: {
      push_onecapture(ms, 0, s, e);
      lua_gettable(L, 3);
      break;
    }
  }
  if (!lua_toboolean(L, -1)) {  /* nil or false? */
    lua_pop(L, 1);
    lua_pushlstring(L, s, (size_t)(e - s));  /* keep original text */
  } else if (!lua_isstring(L, -1)) {
    lj_err_callerv(L, LJ_ERR_STRGSRV, luaL_typename(L, -1));
  }
  luaL_addvalue(b);  /* add result to accumulator */
}